

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecPtr.h
# Opt level: O1

void Vec_PtrPush(Vec_Ptr_t *p,void *Entry)

{
  uint uVar1;
  void **ppvVar2;
  int iVar3;
  
  uVar1 = p->nCap;
  if (p->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (p->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc(0x80);
      }
      else {
        ppvVar2 = (void **)realloc(p->pArray,0x80);
      }
      p->pArray = ppvVar2;
      iVar3 = 0x10;
    }
    else {
      iVar3 = uVar1 * 2;
      if (iVar3 <= (int)uVar1) goto LAB_007e20e3;
      if (p->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar2 = (void **)realloc(p->pArray,(ulong)uVar1 << 4);
      }
      p->pArray = ppvVar2;
    }
    p->nCap = iVar3;
  }
LAB_007e20e3:
  iVar3 = p->nSize;
  p->nSize = iVar3 + 1;
  p->pArray[iVar3] = Entry;
  return;
}

Assistant:

static inline void Vec_PtrPush( Vec_Ptr_t * p, void * Entry )
{
    if ( p->nSize == p->nCap )
    {
        if ( p->nCap < 16 )
            Vec_PtrGrow( p, 16 );
        else
            Vec_PtrGrow( p, 2 * p->nCap );
    }
    p->pArray[p->nSize++] = Entry;
}